

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall application::Chat::cleanInput(Chat *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int local_20;
  int local_1c;
  int i;
  int j;
  int lines;
  int consoleWidth;
  Chat *this_local;
  
  iVar3 = getConsoleWidth(this);
  iVar1 = this->promptLines_;
  iVar2 = this->promptLastLine_;
  lVar4 = std::__cxx11::wstring::size();
  for (local_1c = 0; local_1c < iVar1 + (int)(((iVar2 + lVar4) - 1U) / (ulong)(long)iVar3);
      local_1c = local_1c + 1) {
    std::operator<<((wostream *)&std::wcout,"\r");
    for (local_20 = 0; local_20 < iVar3; local_20 = local_20 + 1) {
      std::operator<<((wostream *)&std::wcout," ");
    }
    std::operator<<((wostream *)&std::wcout,"\r");
    if (local_1c != this->promptLines_ + -1) {
      moveCursor(this,0,1);
    }
  }
  return;
}

Assistant:

void Chat::cleanInput()
{
	int consoleWidth = getConsoleWidth(),
		lines = promptLines_ + (promptLastLine_ + input_.size() - 1) / consoleWidth;

	for (int j = 0; j < lines; j++)
	{
		std::wcout << "\r";
		for (int i = 0; i < consoleWidth; i++)
			std::wcout << " ";
		std::wcout << "\r";
		if (j != promptLines_ - 1)
		{
#ifdef _WIN32
			moveCursor(0, 2);
#else
			moveCursor(0, 1);
#endif
		}
	}
#ifdef _WIN32
	moveCursor(0, 1);
#endif
}